

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator::GenerateParsingCode
          (RepeatedImmutableMessageFieldLiteGenerator *this,Printer *printer)

{
  Type TVar1;
  Printer *printer_local;
  RepeatedImmutableMessageFieldLiteGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (!$is_mutable$) {\n  $name$_ =\n      com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n}\n"
                    );
  TVar1 = GetType(this->descriptor_);
  if (TVar1 == TYPE_GROUP) {
    io::Printer::Print(printer,&this->variables_,
                       "$name$_.add(input.readGroup($number$, $type$.parser(),\n    extensionRegistry));\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "$name$_.add(\n    input.readMessage($type$.parser(), extensionRegistry));\n"
                      );
  }
  return;
}

Assistant:

void RepeatedImmutableMessageFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (!$is_mutable$) {\n"
    "  $name$_ =\n"
    "      com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n"
    "}\n");

    if (GetType(descriptor_) == FieldDescriptor::TYPE_GROUP) {
      printer->Print(variables_,
        "$name$_.add(input.readGroup($number$, $type$.parser(),\n"
        "    extensionRegistry));\n");
    } else {
      printer->Print(variables_,
        "$name$_.add(\n"
        "    input.readMessage($type$.parser(), extensionRegistry));\n");
    }
}